

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O3

Vec_Int_t * Gia_ManGetStateAndCheckCex(Gia_Man_t *pAig,Abc_Cex_t *p,int iFrame)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int iVar7;
  Vec_Int_t *__ptr;
  int *__ptr_00;
  long lVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint local_48;
  
  iVar7 = pAig->nRegs;
  __ptr = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar9 = iVar7;
  }
  __ptr->nSize = 0;
  __ptr->nCap = iVar9;
  if (iVar9 == 0) {
    __ptr_00 = (int *)0x0;
  }
  else {
    __ptr_00 = (int *)malloc((long)iVar9 << 2);
  }
  __ptr->pArray = __ptr_00;
  if ((iFrame < 0) || (p->iFrame < iFrame)) {
    __assert_fail("iFrame >= 0 && iFrame <= p->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                  ,0x100,"Vec_Int_t *Gia_ManGetStateAndCheckCex(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  Gia_ManCleanMark0(pAig);
  iVar7 = pAig->nRegs;
  if (0 < iVar7) {
    iVar9 = 0;
    do {
      iVar14 = pAig->vCis->nSize;
      uVar11 = (iVar14 - iVar7) + iVar9;
      if (((int)uVar11 < 0) || (iVar14 <= (int)uVar11)) goto LAB_006194b0;
      iVar14 = pAig->vCis->pArray[uVar11];
      if (((long)iVar14 < 0) || (pAig->nObjs <= iVar14)) goto LAB_00619491;
      if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &pAig->pObjs[iVar14].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      iVar9 = iVar9 + 1;
      iVar7 = pAig->nRegs;
    } while (iVar9 < iVar7);
  }
  local_48 = p->nRegs;
  if (p->iFrame < 0) {
LAB_00619412:
    if (local_48 != p->nBits) {
      __assert_fail("iBit == p->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOut.c"
                    ,0x117,"Vec_Int_t *Gia_ManGetStateAndCheckCex(Gia_Man_t *, Abc_Cex_t *, int)");
    }
    uVar11 = p->iPo;
    iVar7 = pAig->vCos->nSize;
    if (iVar7 - pAig->nRegs <= (int)uVar11) {
      __assert_fail("v < Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
    }
    if ((-1 < (int)uVar11) && ((int)uVar11 < iVar7)) {
      iVar7 = pAig->vCos->pArray[uVar11];
      if ((-1 < (long)iVar7) && (iVar7 < pAig->nObjs)) {
        if ((pAig->pObjs[iVar7].field_0x3 & 0x40) == 0) {
          if (__ptr_00 != (int *)0x0) {
            free(__ptr_00);
          }
          free(__ptr);
          __ptr = (Vec_Int_t *)0x0;
        }
        Gia_ManCleanMark0(pAig);
        return __ptr;
      }
LAB_00619491:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
LAB_006194b0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar9 = 0;
  do {
    if ((iVar9 == iFrame) && (0 < iVar7)) {
      iVar14 = 0;
      do {
        iVar2 = pAig->vCis->nSize;
        uVar11 = (iVar2 - iVar7) + iVar14;
        if (((int)uVar11 < 0) || (iVar2 <= (int)uVar11)) goto LAB_006194b0;
        iVar2 = pAig->vCis->pArray[uVar11];
        if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) goto LAB_00619491;
        if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
        uVar11 = *(uint *)(pAig->pObjs + iVar2);
        uVar3 = __ptr->nSize;
        if (uVar3 == __ptr->nCap) {
          if ((int)uVar3 < 0x10) {
            if (__ptr_00 == (int *)0x0) {
              __ptr_00 = (int *)malloc(0x40);
            }
            else {
              __ptr_00 = (int *)realloc(__ptr_00,0x40);
            }
            __ptr->pArray = __ptr_00;
            iVar7 = 0x10;
            if (__ptr_00 == (int *)0x0) {
LAB_006194cf:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
          else {
            if (__ptr_00 == (int *)0x0) {
              __ptr_00 = (int *)malloc((ulong)uVar3 * 8);
            }
            else {
              __ptr_00 = (int *)realloc(__ptr_00,(ulong)uVar3 * 8);
            }
            __ptr->pArray = __ptr_00;
            if (__ptr_00 == (int *)0x0) goto LAB_006194cf;
            iVar7 = uVar3 * 2;
          }
          __ptr->nCap = iVar7;
        }
        __ptr->nSize = uVar3 + 1;
        __ptr_00[(int)uVar3] = uVar11 >> 0x1e & 1;
        iVar14 = iVar14 + 1;
        iVar7 = pAig->nRegs;
      } while (iVar14 < iVar7);
    }
    pVVar10 = pAig->vCis;
    uVar12 = (ulong)(uint)pVVar10->nSize;
    if (iVar7 < pVVar10->nSize) {
      lVar8 = 0;
      do {
        if ((int)uVar12 <= lVar8) goto LAB_006194b0;
        lVar13 = (long)pVVar10->pArray[lVar8];
        if ((lVar13 < 0) || (iVar7 = pAig->nObjs, iVar7 <= pVVar10->pArray[lVar8]))
        goto LAB_00619491;
        pGVar5 = pAig->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) {
          local_48 = local_48 + (int)lVar8;
          goto LAB_00619213;
        }
        *(ulong *)(pGVar5 + lVar13) =
             *(ulong *)(pGVar5 + lVar13) & 0xffffffffbfffffff |
             (ulong)(((uint)(&p[1].iPo)[(int)((ulong)local_48 + lVar8) >> 5] >>
                      ((byte)((ulong)local_48 + lVar8) & 0x1f) & 1) << 0x1e);
        lVar8 = lVar8 + 1;
        pVVar10 = pAig->vCis;
        uVar12 = (ulong)pVVar10->nSize;
      } while (lVar8 < (long)(uVar12 - (long)pAig->nRegs));
      local_48 = local_48 + (int)lVar8;
    }
    iVar7 = pAig->nObjs;
    if (0 < iVar7) {
LAB_00619213:
      lVar8 = 0;
      lVar13 = 0;
      do {
        pGVar5 = pAig->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        uVar12 = *(ulong *)(&pGVar5->field_0x0 + lVar8);
        if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
          *(ulong *)(&pGVar5->field_0x0 + lVar8) =
               uVar12 & 0xffffffff3fffffff |
               (ulong)((((uint)(uVar12 >> 0x3d) ^
                        *(uint *)((long)pGVar5 +
                                 (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3 + lVar8) >> 0x1e)
                        & ((uint)(uVar12 >> 0x1d) & 7 ^
                          *(uint *)((long)pGVar5 +
                                   (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3 + lVar8) >>
                          0x1e) & 1) << 0x1e);
          iVar7 = pAig->nObjs;
        }
        lVar13 = lVar13 + 1;
        lVar8 = lVar8 + 0xc;
      } while (lVar13 < iVar7);
    }
    pVVar10 = pAig->vCos;
    if (0 < pVVar10->nSize) {
      lVar8 = 0;
      do {
        iVar7 = pVVar10->pArray[lVar8];
        if (((long)iVar7 < 0) || (pAig->nObjs <= iVar7)) goto LAB_00619491;
        if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar5 = pAig->pObjs + iVar7;
        uVar11 = (uint)*(ulong *)pGVar5;
        *(ulong *)pGVar5 =
             *(ulong *)pGVar5 & 0xffffffffbfffffff |
             (ulong)((uVar11 * 2 ^ *(uint *)(pGVar5 + -(ulong)(uVar11 & 0x1fffffff))) & 0x40000000);
        lVar8 = lVar8 + 1;
        pVVar10 = pAig->vCos;
      } while (lVar8 < pVVar10->nSize);
    }
    iVar14 = p->iFrame;
    if (iVar9 == iVar14) goto LAB_00619412;
    iVar7 = pAig->nRegs;
    if (0 < iVar7) {
      iVar14 = 0;
      do {
        iVar2 = pAig->vCos->nSize;
        uVar11 = (iVar2 - iVar7) + iVar14;
        if (((int)uVar11 < 0) || (iVar2 <= (int)uVar11)) goto LAB_006194b0;
        iVar2 = pAig->vCos->pArray[uVar11];
        if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) goto LAB_00619491;
        pGVar5 = pAig->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        iVar4 = pAig->vCis->nSize;
        uVar11 = (iVar4 - iVar7) + iVar14;
        if (((int)uVar11 < 0) || (iVar4 <= (int)uVar11)) goto LAB_006194b0;
        uVar11 = pAig->vCis->pArray[uVar11];
        lVar8 = (long)(int)uVar11;
        if ((lVar8 < 0) || ((uint)pAig->nObjs <= uVar11)) goto LAB_00619491;
        *(ulong *)(pGVar5 + lVar8) =
             *(ulong *)(pGVar5 + lVar8) & 0xffffffffbfffffff |
             (ulong)((uint)*(undefined8 *)(pGVar5 + iVar2) & 0x40000000);
        iVar14 = iVar14 + 1;
        iVar7 = pAig->nRegs;
      } while (iVar14 < iVar7);
      iVar14 = p->iFrame;
    }
    bVar6 = iVar14 <= iVar9;
    iVar9 = iVar9 + 1;
    if (bVar6) goto LAB_00619412;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManGetStateAndCheckCex( Gia_Man_t * pAig, Abc_Cex_t * p, int iFrame )
{
    Vec_Int_t * vInit = Vec_IntAlloc( Gia_ManRegNum(pAig) );
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    assert( iFrame >= 0 && iFrame <= p->iFrame );
    Gia_ManCleanMark0(pAig);
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark0 = 0;//Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0, iBit = p->nRegs; i <= p->iFrame; i++ )
    {
        if ( i == iFrame )
        {
            Gia_ManForEachRo( pAig, pObjRo, k )
                Vec_IntPush( vInit, pObjRo->fMark0 );
        }
        Gia_ManForEachPi( pAig, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(p->pData, iBit++);
        Gia_ManForEachAnd( pAig, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( pAig, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( iBit == p->nBits );
    RetValue = Gia_ManPo(pAig, p->iPo)->fMark0;
    if ( RetValue != 1 )
        Vec_IntFreeP( &vInit );
    Gia_ManCleanMark0(pAig);
    return vInit;
}